

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O0

void __thiscall Pl_PNGFilter::finish(Pl_PNGFilter *this)

{
  element_type *peVar1;
  Pipeline *pPVar2;
  Pl_PNGFilter *this_local;
  
  if (this->pos != 0) {
    processRow(this);
  }
  this->prev_row = (uchar *)0x0;
  peVar1 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
  this->cur_row = peVar1;
  this->pos = 0;
  memset(this->cur_row,0,(ulong)(this->bytes_per_row + 1));
  pPVar2 = Pipeline::next(&this->super_Pipeline);
  (*pPVar2->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_PNGFilter::finish()
{
    if (this->pos) {
        // write partial row
        processRow();
    }
    this->prev_row = nullptr;
    this->cur_row = buf1.get();
    this->pos = 0;
    memset(this->cur_row, 0, this->bytes_per_row + 1);

    next()->finish();
}